

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rb_generator.cc
# Opt level: O0

void __thiscall
t_rb_generator::generate_rb_struct_required_validator
          (t_rb_generator *this,t_rb_ofstream *out,t_struct *tstruct)

{
  bool bVar1;
  e_req eVar2;
  uint uVar3;
  t_rb_ofstream *ptVar4;
  ostream *poVar5;
  reference pptVar6;
  t_type *ptVar7;
  string *psVar8;
  string local_80;
  t_field *local_60;
  t_field *field_1;
  t_field **local_50;
  t_field *local_48;
  t_field *field;
  t_field **local_38;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_30;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  t_struct *tstruct_local;
  t_rb_ofstream *out_local;
  t_rb_generator *this_local;
  
  ptVar4 = t_rb_ofstream::indent(out);
  poVar5 = std::operator<<((ostream *)ptVar4,"def validate");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_rb_ofstream::indent_up(out);
  f_iter._M_current = (t_field **)t_struct::get_members(tstruct);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_30);
  local_38 = (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  local_30._M_current = local_38;
  while( true ) {
    field = (t_field *)
            std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                      ((vector<t_field_*,_std::allocator<t_field_*>_> *)f_iter._M_current);
    bVar1 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)&field);
    if (!bVar1) break;
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_30);
    local_48 = *pptVar6;
    eVar2 = t_field::get_req(local_48);
    if (eVar2 == T_REQUIRED) {
      ptVar4 = t_rb_ofstream::indent(out);
      poVar5 = std::operator<<((ostream *)ptVar4,
                               "raise ::Thrift::ProtocolException.new(::Thrift::ProtocolException::UNKNOWN, \'Required field "
                              );
      psVar8 = t_field::get_name_abi_cxx11_(local_48);
      poVar5 = std::operator<<(poVar5,(string *)psVar8);
      std::operator<<(poVar5," is unset!\')");
      ptVar7 = t_field::get_type(local_48);
      uVar3 = (*(ptVar7->super_t_doc)._vptr_t_doc[8])();
      if ((uVar3 & 1) == 0) {
        poVar5 = std::operator<<((ostream *)out," unless @");
        psVar8 = t_field::get_name_abi_cxx11_(local_48);
        std::operator<<(poVar5,(string *)psVar8);
      }
      else {
        poVar5 = std::operator<<((ostream *)out," if @");
        psVar8 = t_field::get_name_abi_cxx11_(local_48);
        poVar5 = std::operator<<(poVar5,(string *)psVar8);
        std::operator<<(poVar5,".nil?");
      }
      std::operator<<((ostream *)out,(string *)&::endl_abi_cxx11_);
    }
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_30);
  }
  local_50 = (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  local_30._M_current = local_50;
  while( true ) {
    field_1 = (t_field *)
              std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                        ((vector<t_field_*,_std::allocator<t_field_*>_> *)f_iter._M_current);
    bVar1 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)&field_1);
    if (!bVar1) break;
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_30);
    local_60 = *pptVar6;
    ptVar7 = t_field::get_type(local_60);
    uVar3 = (*(ptVar7->super_t_doc)._vptr_t_doc[10])();
    if ((uVar3 & 1) != 0) {
      ptVar4 = t_rb_ofstream::indent(out);
      poVar5 = std::operator<<((ostream *)ptVar4,"unless @");
      psVar8 = t_field::get_name_abi_cxx11_(local_60);
      poVar5 = std::operator<<(poVar5,(string *)psVar8);
      poVar5 = std::operator<<(poVar5,".nil? || ");
      ptVar7 = t_field::get_type(local_60);
      full_type_name_abi_cxx11_(&local_80,this,ptVar7);
      poVar5 = std::operator<<(poVar5,(string *)&local_80);
      poVar5 = std::operator<<(poVar5,"::VALID_VALUES.include?(@");
      psVar8 = t_field::get_name_abi_cxx11_(local_60);
      poVar5 = std::operator<<(poVar5,(string *)psVar8);
      poVar5 = std::operator<<(poVar5,")");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_80);
      t_rb_ofstream::indent_up(out);
      ptVar4 = t_rb_ofstream::indent(out);
      poVar5 = std::operator<<((ostream *)ptVar4,
                               "raise ::Thrift::ProtocolException.new(::Thrift::ProtocolException::UNKNOWN, \'Invalid value of field "
                              );
      psVar8 = t_field::get_name_abi_cxx11_(local_60);
      poVar5 = std::operator<<(poVar5,(string *)psVar8);
      poVar5 = std::operator<<(poVar5,"!\')");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      t_rb_ofstream::indent_down(out);
      ptVar4 = t_rb_ofstream::indent(out);
      poVar5 = std::operator<<((ostream *)ptVar4,"end");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    }
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_30);
  }
  t_rb_ofstream::indent_down(out);
  ptVar4 = t_rb_ofstream::indent(out);
  poVar5 = std::operator<<((ostream *)ptVar4,"end");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_rb_generator::generate_rb_struct_required_validator(t_rb_ofstream& out, t_struct* tstruct) {
  out.indent() << "def validate" << endl;
  out.indent_up();

  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    t_field* field = (*f_iter);
    if (field->get_req() == t_field::T_REQUIRED) {
      out.indent() << "raise ::Thrift::ProtocolException.new(::Thrift::ProtocolException::UNKNOWN, "
                      "'Required field " << field->get_name() << " is unset!')";
      if (field->get_type()->is_bool()) {
        out << " if @" << field->get_name() << ".nil?";
      } else {
        out << " unless @" << field->get_name();
      }
      out << endl;
    }
  }

  // if field is an enum, check that its value is valid
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    t_field* field = (*f_iter);

    if (field->get_type()->is_enum()) {
      out.indent() << "unless @" << field->get_name() << ".nil? || "
                   << full_type_name(field->get_type()) << "::VALID_VALUES.include?(@"
                   << field->get_name() << ")" << endl;
      out.indent_up();
      out.indent() << "raise ::Thrift::ProtocolException.new(::Thrift::ProtocolException::UNKNOWN, "
                      "'Invalid value of field " << field->get_name() << "!')" << endl;
      out.indent_down();
      out.indent() << "end" << endl;
    }
  }

  out.indent_down();
  out.indent() << "end" << endl << endl;
}